

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O0

void appendOrganizationAndApp(QString *path)

{
  long lVar1;
  bool bVar2;
  QStringBuilder<char16_t,_const_QString_&> *in_RDI;
  long in_FS_OFFSET;
  QString appName;
  QString org;
  QString *in_stack_ffffffffffffff58;
  char16_t *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  undefined2 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::organizationName();
  bVar2 = QString::isEmpty((QString *)0x7dd154);
  if (!bVar2) {
    operator+(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    operator+=((QString *)CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),in_RDI);
  }
  QCoreApplication::applicationName();
  bVar2 = QString::isEmpty((QString *)0x7dd1ef);
  if (!bVar2) {
    uVar3 = 0x2f;
    operator+(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    operator+=((QString *)CONCAT26(uVar3,in_stack_ffffffffffffff90),in_RDI);
  }
  QString::~QString((QString *)0x7dd264);
  QString::~QString((QString *)0x7dd271);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void appendOrganizationAndApp(QString &path)
{
#ifndef QT_BOOTSTRAPPED
    const QString org = QCoreApplication::organizationName();
    if (!org.isEmpty())
        path += u'/' + org;
    const QString appName = QCoreApplication::applicationName();
    if (!appName.isEmpty())
        path += u'/' + appName;
#else
    Q_UNUSED(path);
#endif
}